

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_address.cpp
# Opt level: O0

Address * __thiscall
cfd::ElementsAddressFactory::CreatePegInAddress
          (ElementsAddressFactory *this,AddressType address_type,Script *tweak_fedpegscript)

{
  Address *in_RDI;
  NetType type;
  Script *in_stack_00000060;
  AddressType in_stack_00000068;
  NetType in_stack_0000006c;
  
  CreatePegInAddress(in_stack_0000006c,in_stack_00000068,in_stack_00000060);
  return in_RDI;
}

Assistant:

Address ElementsAddressFactory::CreatePegInAddress(
    AddressType address_type, const Script& tweak_fedpegscript) const {
  NetType type = type_;
  if (type == NetType::kLiquidV1)
    type = NetType::kMainnet;
  else if (type == NetType::kElementsRegtest)
    type = NetType::kRegtest;
  return CreatePegInAddress(type, address_type, tweak_fedpegscript);
}